

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O1

void __thiscall qpdf::Tokenizer::inCharCode(Tokenizer *this,char ch)

{
  int iVar1;
  
  if ((ch & 0xf8U) == 0x30) {
    iVar1 = this->digit_count;
    this->char_code = (uint)(byte)ch + this->char_code * 8 + -0x30;
    this->digit_count = iVar1 + 1;
    if (1 < iVar1) {
      std::__cxx11::string::push_back((char)this + '\x10');
      this->state = st_in_string;
    }
    return;
  }
  std::__cxx11::string::push_back((char)this + '\x10');
  this->state = st_in_string;
  inString(this,ch);
  return;
}

Assistant:

void
Tokenizer::inCharCode(char ch)
{
    bool handled = false;
    if (('0' <= ch) && (ch <= '7')) {
        char_code = 8 * char_code + (int(ch) - int('0'));
        if (++(digit_count) < 3) {
            return;
        }
        handled = true;
    }
    // We've accumulated \ddd or we have \d or \dd followed by other than an octal digit. The PDF
    // Spec says to ignore high-order overflow.
    val += char(char_code % 256);
    state = st_in_string;
    if (!handled) {
        inString(ch);
    }
}